

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

void Kit_TruthForallSet(uint *pRes,uint *pTruth,int nVars,uint uMask)

{
  undefined4 local_24;
  int v;
  uint uMask_local;
  int nVars_local;
  uint *pTruth_local;
  uint *pRes_local;
  
  Kit_TruthCopy(pRes,pTruth,nVars);
  for (local_24 = 0; local_24 < nVars; local_24 = local_24 + 1) {
    if ((uMask & 1 << ((byte)local_24 & 0x1f)) != 0) {
      Kit_TruthForall(pRes,nVars,local_24);
    }
  }
  return;
}

Assistant:

void Kit_TruthForallSet( unsigned * pRes, unsigned * pTruth, int nVars, unsigned uMask )
{
    int v;
    Kit_TruthCopy( pRes, pTruth, nVars );
    for ( v = 0; v < nVars; v++ )
        if ( uMask & (1 << v) )
            Kit_TruthForall( pRes, nVars, v );
}